

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void CEditor::CallbackSaveMap(char *pFileName,int StorageType,void *pUser)

{
  int iVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  bool bVar3;
  char aBuf [1024];
  char acStack_428 [1024];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = str_endswith(pFileName,".map");
  if (pcVar2 == (char *)0x0) {
    str_format(acStack_428,0x400,"%s.map",pFileName);
    pFileName = acStack_428;
  }
  iVar1 = Save((CEditor *)pUser,pFileName);
  if (iVar1 != 0) {
    str_copy((char *)((long)pUser + 0x49c),pFileName,0x200);
    if (StorageType == 0) {
      bVar3 = *(long *)((long)pUser + 0xed0) == (long)pUser + 0xad0;
    }
    else {
      bVar3 = false;
    }
    *(bool *)((long)pUser + 0x89c) = bVar3;
    *(undefined1 *)((long)pUser + 0x1248) = 0;
  }
  *(undefined4 *)((long)pUser + 0x47c) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::CallbackSaveMap(const char *pFileName, int StorageType, void *pUser)
{
	CEditor *pEditor = static_cast<CEditor*>(pUser);
	char aBuf[1024];
	// add map extension
	if(!str_endswith(pFileName, ".map"))
	{
		str_format(aBuf, sizeof(aBuf), "%s.map", pFileName);
		pFileName = aBuf;
	}

	if(pEditor->Save(pFileName))
	{
		str_copy(pEditor->m_aFileName, pFileName, sizeof(pEditor->m_aFileName));
		pEditor->m_ValidSaveFilename = StorageType == IStorage::TYPE_SAVE && pEditor->m_pFileDialogPath == pEditor->m_aFileDialogCurrentFolder;
		pEditor->m_Map.m_Modified = false;
	}

	pEditor->m_Dialog = DIALOG_NONE;
}